

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

char * GrowSubId(char **p)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  byte *pbVar6;
  
  cVar2 = DAT_0018e517;
  pbVar6 = (byte *)*p;
  bVar1 = *pbVar6;
  bVar3 = bVar1;
  do {
    iVar4 = isalnum((uint)bVar3);
    if ((iVar4 == 0) &&
       ((0x3e < bVar3 - 0x21 || ((0x40000000c0002005U >> ((ulong)(bVar3 - 0x21) & 0x3f) & 1) == 0)))
       ) break;
    *p = (char *)(pbVar6 + 1);
    pcVar5 = nidsubp + 1;
    *nidsubp = *pbVar6;
    nidsubp = pcVar5;
    pbVar6 = (byte *)*p;
    bVar3 = *pbVar6;
  } while ((cVar2 == '\0') || ((bVar1 != 0x5f) == (bVar3 != 0x5f)));
  if (nidtemp + 0x7ff < nidsubp) {
    Error("ID too long, buffer overflow detected.",(char *)0x0,FATAL);
  }
  *nidsubp = '\0';
  pcVar5 = (char *)0x0;
  if (nidtemp[0] != '\0') {
    pcVar5 = nidtemp;
  }
  return pcVar5;
}

Assistant:

char* GrowSubId(char* & p) {	// appends next part of ID
	// The caller function ReplaceDefineInternal already assures the first char of ID is (isalpha() || '_')
	// so there are no extra tests here to verify validity of first character (like GetID(..) must do)
	const bool isSubwordSubstitution = Options::syx.IsSubwordSubstitution;	// help compiler -O2
	bool startsAtUnderscore = ('_' == *p);
	// add sub-parts delimiter in separate step (i.e. new ID grows like: "a", "a_", "a_b", ...)
	while (islabchar(*p)) {
		*nidsubp++ = *p++;
		// break at sub-word boundaries when new underscore block starts or ends
		if (isSubwordSubstitution && (('_' == *p) != startsAtUnderscore)) break;
	}
	if (nidtemp+LINEMAX <= nidsubp) Error("ID too long, buffer overflow detected.", NULL, FATAL);
	*nidsubp = 0;
	return nidtemp[0] ? nidtemp : nullptr;	// return non-empty string or nullptr
}